

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

GLenum deqp::gls::FboUtil::config::glTarget(Image *img)

{
  long local_68;
  long local_58;
  long local_48;
  long local_38;
  long local_28;
  Image *img_local;
  
  if (img == (Image *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = __dynamic_cast(img,&Image::typeinfo,&Renderbuffer::typeinfo,0);
  }
  if (local_28 == 0) {
    if (img == (Image *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = __dynamic_cast(img,&Image::typeinfo,&Texture2D::typeinfo,0);
    }
    if (local_38 == 0) {
      if (img == (Image *)0x0) {
        local_48 = 0;
      }
      else {
        local_48 = __dynamic_cast(img,&Image::typeinfo,&TextureCubeMap::typeinfo,0);
      }
      if (local_48 == 0) {
        if (img == (Image *)0x0) {
          local_58 = 0;
        }
        else {
          local_58 = __dynamic_cast(img,&Image::typeinfo,&Texture3D::typeinfo,0);
        }
        if (local_58 == 0) {
          if (img == (Image *)0x0) {
            local_68 = 0;
          }
          else {
            local_68 = __dynamic_cast(img,&Image::typeinfo,&Texture2DArray::typeinfo,0);
          }
          if (local_68 == 0) {
            img_local._4_4_ = 0;
          }
          else {
            img_local._4_4_ = 0x8c1a;
          }
        }
        else {
          img_local._4_4_ = 0x806f;
        }
      }
      else {
        img_local._4_4_ = 0x8513;
      }
    }
    else {
      img_local._4_4_ = 0xde1;
    }
  }
  else {
    img_local._4_4_ = 0x8d41;
  }
  return img_local._4_4_;
}

Assistant:

static GLenum glTarget (const Image& img)
{
	if (dynamic_cast<const Renderbuffer*>(&img) != DE_NULL)
		return GL_RENDERBUFFER;
	if (dynamic_cast<const Texture2D*>(&img) != DE_NULL)
		return GL_TEXTURE_2D;
	if (dynamic_cast<const TextureCubeMap*>(&img) != DE_NULL)
		return GL_TEXTURE_CUBE_MAP;
	if (dynamic_cast<const Texture3D*>(&img) != DE_NULL)
		return GL_TEXTURE_3D;
	if (dynamic_cast<const Texture2DArray*>(&img) != DE_NULL)
		return GL_TEXTURE_2D_ARRAY;

	DE_FATAL("Impossible image type");
	return GL_NONE;
}